

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall cmComputeTargetDepends::DisplaySideEffects(cmComputeTargetDepends *this)

{
  mapped_type_conflict1 mVar1;
  FILE *pFVar2;
  cmComputeTargetDepends *pcVar3;
  string *psVar4;
  pointer pTVar5;
  mapped_type_conflict1 *pmVar6;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  long lVar9;
  cmGeneratorTarget *gt;
  cmComputeTargetDepends *local_50;
  map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
  *local_48;
  long local_40;
  long local_38;
  
  fwrite("The side effects are:\n",0x16,1,_stderr);
  local_40 = ((long)(this->SideEffects).
                    super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->SideEffects).
                   super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x60;
  local_48 = &this->TargetIndex;
  lVar9 = 0;
  local_50 = this;
  while (pcVar3 = local_50, pFVar2 = _stderr, lVar9 != local_40) {
    psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((local_50->Targets).
                        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar9]);
    fprintf(pFVar2,"target %zu is [%s]\n",lVar9,(psVar4->_M_dataplus)._M_p);
    pTVar5 = (pcVar3->SideEffects).
             super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_38 = lVar9;
    if (*(size_t *)((long)&pTVar5[lVar9].CustomCommandSideEffects._M_t._M_impl + 0x28) != 0) {
      fwrite("  custom commands\n",0x12,1,_stderr);
      pTVar5 = (local_50->SideEffects).
               super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (p_Var8 = *(_Base_ptr *)
                     ((long)&pTVar5[lVar9].CustomCommandSideEffects._M_t._M_impl + 0x18);
          pFVar2 = _stderr,
          p_Var8 != (_Rb_tree_node_base *)
                    ((long)&pTVar5[lVar9].CustomCommandSideEffects._M_t._M_impl + 8U);
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        gt = *(cmGeneratorTarget **)(p_Var8 + 1);
        pmVar6 = std::
                 map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                 ::operator[](local_48,&gt);
        mVar1 = *pmVar6;
        psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(gt);
        fprintf(pFVar2,"    from target %zu [%s]\n",mVar1,(psVar4->_M_dataplus)._M_p);
      }
      pTVar5 = (local_50->SideEffects).
               super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    for (p_Var8 = *(_Base_ptr *)((long)&pTVar5[lVar9].LanguageSideEffects._M_t._M_impl + 0x18);
        p_Var8 != (_Rb_tree_node_base *)((long)&pTVar5[lVar9].LanguageSideEffects._M_t._M_impl + 8U)
        ; p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      fprintf(_stderr,"  language %s\n",*(undefined8 *)(p_Var8 + 1));
      for (p_Var7 = p_Var8[2]._M_right; pFVar2 = _stderr,
          p_Var7 != (_Rb_tree_node_base *)&p_Var8[2]._M_parent;
          p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
        gt = *(cmGeneratorTarget **)(p_Var7 + 1);
        pmVar6 = std::
                 map<const_cmGeneratorTarget_*,_unsigned_long,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_long>_>_>
                 ::operator[](local_48,&gt);
        mVar1 = *pmVar6;
        psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(gt);
        fprintf(pFVar2,"    from target %zu [%s]\n",mVar1,(psVar4->_M_dataplus)._M_p);
      }
    }
    lVar9 = local_38 + 1;
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void cmComputeTargetDepends::DisplaySideEffects()
{
  fprintf(stderr, "The side effects are:\n");
  size_t n = this->SideEffects.size();
  for (size_t depender_index = 0; depender_index < n; ++depender_index) {
    cmGeneratorTarget const* depender = this->Targets[depender_index];
    fprintf(stderr, "target %zu is [%s]\n", depender_index,
            depender->GetName().c_str());
    if (!this->SideEffects[depender_index].CustomCommandSideEffects.empty()) {
      fprintf(stderr, "  custom commands\n");
      for (auto const* gt :
           this->SideEffects[depender_index].CustomCommandSideEffects) {
        fprintf(stderr, "    from target %zu [%s]\n", this->TargetIndex[gt],
                gt->GetName().c_str());
      }
    }
    for (auto const& it :
         this->SideEffects[depender_index].LanguageSideEffects) {
      fprintf(stderr, "  language %s\n", it.first.c_str());
      for (auto const* gt : it.second) {
        fprintf(stderr, "    from target %zu [%s]\n", this->TargetIndex[gt],
                gt->GetName().c_str());
      }
    }
  }
  fprintf(stderr, "\n");
}